

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * common_detokenize_abi_cxx11_
                   (string *__return_storage_ptr__,llama_vocab *vocab,
                   vector<int,_std::allocator<int>_> *tokens,bool special)

{
  pointer piVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 uVar3;
  undefined8 uVar4;
  
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  piVar1 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar4 = CONCAT44(uVar3,(uint)special);
  iVar2 = llama_detokenize(vocab,piVar1,
                           (ulong)((long)(tokens->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar1)
                           >> 2,(__return_storage_ptr__->_M_dataplus)._M_p,
                           (int)__return_storage_ptr__->_M_string_length,0,uVar4);
  uVar3 = (undefined4)((ulong)uVar4 >> 0x20);
  if (iVar2 < 0) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    piVar1 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    iVar2 = llama_detokenize(vocab,piVar1,
                             (ulong)((long)(tokens->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data._M_finish - (long)piVar1)
                             >> 2,(__return_storage_ptr__->_M_dataplus)._M_p,
                             (int)__return_storage_ptr__->_M_string_length,0,
                             CONCAT44(uVar3,(uint)special));
    if ((int)__return_storage_ptr__->_M_string_length < iVar2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
                 ,0x514,"GGML_ASSERT(%s) failed","n_chars <= (int32_t)text.size()");
    }
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string common_detokenize(const struct llama_vocab * vocab, const std::vector<llama_token> & tokens, bool special) {
    std::string text;
    text.resize(std::max(text.capacity(), tokens.size()));
    int32_t n_chars = llama_detokenize(vocab, tokens.data(), (int32_t)tokens.size(), &text[0], (int32_t)text.size(), false, special);
    if (n_chars < 0) {
        text.resize(-n_chars);
        n_chars = llama_detokenize(vocab, tokens.data(), (int32_t)tokens.size(), &text[0], (int32_t)text.size(), false, special);
        GGML_ASSERT(n_chars <= (int32_t)text.size());  // whitespace trimming is performed after per-token detokenization
    }

    text.resize(n_chars);

    // NOTE: the original tokenizer decodes bytes after collecting the pieces.
    return text;
}